

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

String * format<long,int>(String *__return_storage_ptr__,String *fmtstr,long *raw_args,
                         int *raw_args_1)

{
  vector<String,_std::allocator<String>_> args;
  vector<String,_std::allocator<String>_> local_38;
  unsigned_long local_20;
  unsigned_long local_18;
  
  local_38.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  expandFormatArguments<long,int>(&local_38,raw_args,raw_args_1);
  if ((long)local_38.super__Vector_base<String,_std::allocator<String>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_38.super__Vector_base<String,_std::allocator<String>_>._M_impl.
            super__Vector_impl_data._M_start != 0x40) {
    local_18 = (long)local_38.super__Vector_base<String,_std::allocator<String>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_38.super__Vector_base<String,_std::allocator<String>_>._M_impl.
                     super__Vector_impl_data._M_start >> 5;
    local_20 = 2;
    error<unsigned_long,unsigned_long>
              ("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/format.h:200: args.size() (%1) does not equal sizeof... (raw_args) (%2)"
               ,&local_18,&local_20);
  }
  formatArgs(__return_storage_ptr__,fmtstr,&local_38);
  std::vector<String,_std::allocator<String>_>::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

String format (const String& fmtstr, const argtypes&... raw_args)
{
	std::vector<String> args;
	expandFormatArguments (args, raw_args...);
	ASSERT_EQ (args.size(), sizeof... (raw_args))
	return formatArgs (fmtstr, args);
}